

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

void cfd::core::SetKeyPathMap
               (vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *key_list,
               wally_map *map_obj)

{
  allocator<unsigned_char> *this;
  wally_map *map_in;
  bool bVar1;
  size_t sVar2;
  uchar *pub_key;
  size_type pub_key_len;
  uchar *fingerprint_00;
  uint *path_00;
  size_type path_len;
  CfdException *this_00;
  allocator local_181;
  string local_180;
  CfdSourceLocation local_160;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_148;
  Pubkey local_130;
  ByteData local_118;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_100;
  undefined1 local_e8 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> path;
  ByteData fp;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_b0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> fingerprint;
  Pubkey local_88;
  ByteData local_70;
  undefined1 local_58 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> key_vec;
  KeyData *key;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *__range2;
  wally_map *pwStack_18;
  int ret;
  wally_map *map_obj_local;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *key_list_local;
  
  pwStack_18 = map_obj;
  map_obj_local = (wally_map *)key_list;
  __end2 = ::std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::begin(key_list);
  key = (KeyData *)
        ::std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::end(key_list);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_cfd::core::KeyData_*,_std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>_>
                                *)&key);
    if (!bVar1) {
      return;
    }
    key_vec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)__gnu_cxx::
                  __normal_iterator<const_cfd::core::KeyData_*,_std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>_>
                  ::operator*(&__end2);
    KeyData::GetPubkey(&local_88,
                       (KeyData *)
                       key_vec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
    Pubkey::GetData(&local_70,&local_88);
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58,&local_70);
    ByteData::~ByteData(&local_70);
    Pubkey::~Pubkey(&local_88);
    this = (allocator<unsigned_char> *)
           ((long)&fp.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    ::std::allocator<unsigned_char>::allocator(this);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(local_b0,4,this);
    ::std::allocator<unsigned_char>::~allocator
              ((allocator<unsigned_char> *)
               ((long)&fp.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    KeyData::GetFingerprint
              ((ByteData *)
               &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               (KeyData *)
               key_vec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
    KeyData::GetChildNumArray
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e8,
               (KeyData *)
               key_vec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
    bVar1 = ByteData::IsEmpty((ByteData *)
                              &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
    if ((bVar1) &&
       (bVar1 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e8), bVar1))
    {
      KeyData::GetPubkey(&local_130,
                         (KeyData *)
                         key_vec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
      Pubkey::GetFingerprint(&local_118,&local_130,4);
      ByteData::GetBytes(&local_100,&local_118);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(local_b0,&local_100);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_100);
      ByteData::~ByteData(&local_118);
      Pubkey::~Pubkey(&local_130);
    }
    else {
      sVar2 = ByteData::GetDataSize
                        ((ByteData *)
                         &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (3 < sVar2) {
        ByteData::GetBytes(&local_148,
                           (ByteData *)
                           &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(local_b0,&local_148)
        ;
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_148);
      }
    }
    map_in = pwStack_18;
    pub_key = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58);
    pub_key_len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58);
    fingerprint_00 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_b0);
    path_00 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e8);
    path_len = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e8);
    __range2._4_4_ =
         wally_map_add_keypath_item(map_in,pub_key,pub_key_len,fingerprint_00,4,path_00,path_len);
    if (__range2._4_4_ != 0) break;
    ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e8);
    ByteData::~ByteData((ByteData *)
                        &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(local_b0);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58);
    __gnu_cxx::
    __normal_iterator<const_cfd::core::KeyData_*,_std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>_>
    ::operator++(&__end2);
  }
  wally_map_free(pwStack_18);
  local_160.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
               ,0x2f);
  local_160.filename = local_160.filename + 1;
  local_160.line = 0x44;
  local_160.funcname = "SetKeyPathMap";
  logger::warn<int&>(&local_160,"wally_map_add_keypath_item NG[{}]",(int *)((long)&__range2 + 4));
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_180,"psbt add keypath error.",&local_181);
  CfdException::CfdException(this_00,kCfdMemoryFullError,&local_180);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

static void SetKeyPathMap(
    const std::vector<KeyData> &key_list, struct wally_map *map_obj) {
  int ret;
  for (auto &key : key_list) {
    auto key_vec = key.GetPubkey().GetData().GetBytes();
    std::vector<uint8_t> fingerprint(4);
    auto fp = key.GetFingerprint();
    auto path = key.GetChildNumArray();
    if (fp.IsEmpty() && path.empty()) {
      fingerprint = key.GetPubkey().GetFingerprint().GetBytes();
    } else if (fp.GetDataSize() >= 4) {
      fingerprint = fp.GetBytes();
    }

    ret = wally_map_add_keypath_item(
        map_obj, key_vec.data(), key_vec.size(), fingerprint.data(), 4,
        path.data(), path.size());
    if (ret != WALLY_OK) {
      wally_map_free(map_obj);
      warn(CFD_LOG_SOURCE, "wally_map_add_keypath_item NG[{}]", ret);
      throw CfdException(kCfdMemoryFullError, "psbt add keypath error.");
    }
  }
}